

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_ReadObject(JSContext *ctx,uint8_t *buf,size_t buf_len,int flags)

{
  JSContext *ctx_00;
  uint32_t uVar1;
  JSAtom *pJVar2;
  int iVar3;
  JSAtom JVar4;
  JSString *p;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  JSValue JVar9;
  BCReaderState local_80;
  ulong local_38;
  int64_t iVar5;
  
  ctx->binary_object_count = ctx->binary_object_count + 1;
  ctx->binary_object_size = ctx->binary_object_size + (int)buf_len;
  local_80.ptr = (uint8_t *)0x0;
  local_80.objects = (JSObject **)0x0;
  local_80.idx_to_atom = (JSAtom *)0x0;
  local_80.objects_count = 0;
  local_80.objects_size = 0;
  local_80.buf_end = buf + buf_len;
  local_80._48_8_ =
       (ulong)((flags & 8U) << 0x15 | (uint)flags >> 2 & 1 | (flags & 2U) << 0xf | (flags & 1U) << 8
              ) << 0x20;
  local_80.first_atom = 0xd2;
  if ((flags & 1U) == 0) {
    local_80.first_atom = 1;
  }
  local_80.idx_to_atom_count = 0;
  uVar1 = local_80.idx_to_atom_count;
  local_80.idx_to_atom_count = 0;
  local_80.ctx = ctx;
  local_80.buf_start = buf;
  if ((long)buf_len < 1) {
    local_80.idx_to_atom_count = uVar1;
    JS_ThrowSyntaxError(ctx,"read after the end of the buffer");
  }
  else {
    local_80.ptr = buf + 1;
    if (*buf == 1) {
      iVar3 = bc_get_leb128(&local_80,&local_80.idx_to_atom_count);
      if (iVar3 == 0) {
        if ((ulong)local_80.idx_to_atom_count != 0) {
          local_80.idx_to_atom =
               (JSAtom *)js_mallocz(local_80.ctx,(ulong)local_80.idx_to_atom_count << 2);
          if (local_80.idx_to_atom == (JSAtom *)0x0) goto LAB_0012a72a;
          uVar6 = 0;
          do {
            p = JS_ReadString(&local_80);
            if ((p == (JSString *)0x0) ||
               (JVar4 = JS_NewAtomStr((JSContext *)(local_80.ctx)->rt,p), JVar4 == 0))
            goto LAB_0012a72a;
            local_80.idx_to_atom[uVar6] = JVar4;
            if (((local_80._48_8_ & 0xff000000000000) != 0) &&
               (local_80.first_atom + (int)uVar6 != JVar4)) {
              local_80._48_8_ = local_80._48_8_ & 0xff00ffffffffffff;
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < local_80.idx_to_atom_count);
        }
        JVar9 = JS_ReadObjectRec(&local_80);
        iVar5 = JVar9.tag;
        uVar8 = (ulong)JVar9.u.ptr & 0xffffffff00000000;
        uVar6 = (ulong)JVar9.u._0_4_;
        goto LAB_0012a72d;
      }
    }
    else {
      JS_ThrowSyntaxError(ctx,"invalid version (%d expected=%d)",(ulong)*buf,1);
    }
  }
LAB_0012a72a:
  uVar6 = 0;
  iVar5 = 6;
  uVar8 = 0;
LAB_0012a72d:
  pJVar2 = local_80.idx_to_atom;
  ctx_00 = local_80.ctx;
  if (local_80.idx_to_atom != (JSAtom *)0x0) {
    uVar7 = (ulong)local_80.idx_to_atom_count;
    local_38 = uVar6;
    if (uVar7 != 0) {
      uVar6 = 0;
      do {
        JS_FreeAtom(ctx_00,pJVar2[uVar6]);
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
    (*(ctx_00->rt->mf).js_free)(&ctx_00->rt->malloc_state,pJVar2);
    uVar6 = local_38;
  }
  (*(ctx_00->rt->mf).js_free)(&ctx_00->rt->malloc_state,local_80.objects);
  JVar9.tag = iVar5;
  JVar9.u.ptr = (void *)(uVar8 | uVar6);
  return JVar9;
}

Assistant:

JSValue JS_ReadObject(JSContext *ctx, const uint8_t *buf, size_t buf_len,
                       int flags)
{
    BCReaderState ss, *s = &ss;
    JSValue obj;

    ctx->binary_object_count += 1;
    ctx->binary_object_size += buf_len;

    memset(s, 0, sizeof(*s));
    s->ctx = ctx;
    s->buf_start = buf;
    s->buf_end = buf + buf_len;
    s->ptr = buf;
    s->allow_bytecode = ((flags & JS_READ_OBJ_BYTECODE) != 0);
    s->is_rom_data = ((flags & JS_READ_OBJ_ROM_DATA) != 0);
    s->allow_sab = ((flags & JS_READ_OBJ_SAB) != 0);
    s->allow_reference = ((flags & JS_READ_OBJ_REFERENCE) != 0);
    if (s->allow_bytecode)
        s->first_atom = JS_ATOM_END;
    else
        s->first_atom = 1;
    if (JS_ReadObjectAtoms(s)) {
        obj = JS_EXCEPTION;
    } else {
        obj = JS_ReadObjectRec(s);
    }
    bc_reader_free(s);
    return obj;
}